

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilsTest.hpp
# Opt level: O2

void Qentem::Test::TestTrim(QTest *test)

{
  SizeT SVar1;
  uint uVar2;
  SizeT SVar3;
  uint local_3c;
  SizeT length;
  SizeT offset;
  
  offset = 0;
  length = 0;
  StringUtils::Trim<char,unsigned_int>("",&offset,&length);
  local_3c = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x1ca);
  local_3c = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x1cb);
  offset = 0;
  SVar1 = 1;
  length = SVar1;
  StringUtils::Trim<char,unsigned_int>(" ",&offset,&length);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x1d0);
  local_3c = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x1d1);
  offset = 0;
  length = SVar1;
  StringUtils::Trim<char,unsigned_int>("  ",&offset,&length);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x1d6);
  local_3c = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x1d7);
  offset = 0;
  SVar1 = 2;
  length = SVar1;
  StringUtils::Trim<char,unsigned_int>("  ",&offset,&length);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x1dc);
  local_3c = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x1dd);
  offset = 0;
  length = SVar1;
  StringUtils::Trim<char,unsigned_int>(" a",&offset,&length);
  SVar1 = 1;
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x1e2);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x1e3);
  offset = 0;
  length = 4;
  StringUtils::Trim<char,unsigned_int>(" abc",&offset,&length);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x1e8);
  SVar3 = 3;
  local_3c = SVar3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x1e9);
  length = SVar1;
  offset = SVar1;
  StringUtils::Trim<char,unsigned_int>(" a",&offset,&length);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x1ee);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x1ef);
  length = SVar3;
  offset = SVar1;
  StringUtils::Trim<char,unsigned_int>(" abc",&offset,&length);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,500);
  local_3c = SVar3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x1f5);
  SVar1 = 2;
  length = 1;
  offset = SVar1;
  StringUtils::Trim<char,unsigned_int>("  a",&offset,&length);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x1fa);
  local_3c = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x1fb);
  SVar3 = 3;
  length = SVar3;
  offset = SVar1;
  StringUtils::Trim<char,unsigned_int>("  abc",&offset,&length);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x200);
  local_3c = SVar3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x201);
  offset = 0;
  length = SVar3;
  StringUtils::Trim<char,unsigned_int>("  a",&offset,&length);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x206);
  local_3c = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x207);
  offset = 0;
  length = 5;
  StringUtils::Trim<char,unsigned_int>("  abc",&offset,&length);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x20c);
  uVar2 = 3;
  local_3c = uVar2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x20d);
  offset = 0;
  length = 4;
  StringUtils::Trim<char,unsigned_int>("   a",&offset,&length);
  local_3c = uVar2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x212);
  local_3c = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x213);
  offset = 0;
  length = 6;
  StringUtils::Trim<char,unsigned_int>("   abc",&offset,&length);
  local_3c = uVar2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x218);
  local_3c = uVar2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x219);
  offset = 0;
  length = 2;
  StringUtils::Trim<char,unsigned_int>("a ",&offset,&length);
  local_3c = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x21e);
  SVar1 = 1;
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x21f);
  offset = 0;
  length = 4;
  StringUtils::Trim<char,unsigned_int>("abc ",&offset,&length);
  local_3c = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x224);
  local_3c = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x225);
  offset = 0;
  length = SVar1;
  StringUtils::Trim<char,unsigned_int>("a ",&offset,&length);
  local_3c = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x22a);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x22b);
  offset = 0;
  SVar3 = 3;
  length = SVar3;
  StringUtils::Trim<char,unsigned_int>("abc ",&offset,&length);
  local_3c = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x230);
  local_3c = SVar3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x231);
  offset = 0;
  length = SVar1;
  StringUtils::Trim<char,unsigned_int>("a  ",&offset,&length);
  local_3c = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x236);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x237);
  offset = 0;
  length = SVar3;
  StringUtils::Trim<char,unsigned_int>("abc  ",&offset,&length);
  local_3c = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x23c);
  local_3c = SVar3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x23d);
  offset = 0;
  length = SVar3;
  StringUtils::Trim<char,unsigned_int>("a  ",&offset,&length);
  local_3c = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x242);
  uVar2 = 1;
  local_3c = uVar2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x243);
  offset = 0;
  length = 5;
  StringUtils::Trim<char,unsigned_int>("abc  ",&offset,&length);
  local_3c = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x248);
  local_3c = SVar3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x249);
  offset = 0;
  length = 4;
  StringUtils::Trim<char,unsigned_int>("a   ",&offset,&length);
  local_3c = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x24e);
  local_3c = uVar2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x24f);
  offset = 0;
  length = 6;
  StringUtils::Trim<char,unsigned_int>("abc   ",&offset,&length);
  local_3c = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x254);
  local_3c = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x255);
  offset = 0;
  length = 3;
  StringUtils::Trim<char,unsigned_int>(" a ",&offset,&length);
  local_3c = uVar2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x25a);
  local_3c = uVar2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x25b);
  offset = 0;
  length = 5;
  StringUtils::Trim<char,unsigned_int>(" abc ",&offset,&length);
  local_3c = uVar2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x260);
  local_3c = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x261);
  offset = 0;
  length = 5;
  StringUtils::Trim<char,unsigned_int>("  a  ",&offset,&length);
  local_3c = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x266);
  local_3c = uVar2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x267);
  offset = 0;
  length = 7;
  StringUtils::Trim<char,unsigned_int>("  abc  ",&offset,&length);
  local_3c = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x26c);
  local_3c = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x26d);
  offset = 0;
  length = 7;
  StringUtils::Trim<char,unsigned_int>("   a   ",&offset,&length);
  local_3c = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x272);
  SVar3 = 1;
  local_3c = SVar3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x273);
  offset = 0;
  length = 9;
  StringUtils::Trim<char,unsigned_int>("   abc   ",&offset,&length);
  SVar1 = 3;
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x278);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x279);
  length = SVar3;
  offset = SVar3;
  StringUtils::Trim<char,unsigned_int>(" a ",&offset,&length);
  local_3c = SVar3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x27e);
  local_3c = SVar3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x27f);
  length = SVar1;
  offset = SVar3;
  StringUtils::Trim<char,unsigned_int>(" abc ",&offset,&length);
  local_3c = SVar3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x284);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x285);
  SVar1 = 2;
  length = SVar3;
  offset = SVar1;
  StringUtils::Trim<char,unsigned_int>("  a  ",&offset,&length);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x28a);
  local_3c = SVar3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x28b);
  SVar3 = 3;
  length = SVar3;
  offset = SVar1;
  StringUtils::Trim<char,unsigned_int>("  abc  ",&offset,&length);
  local_3c = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x290);
  local_3c = SVar3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x291);
  length = 1;
  offset = SVar3;
  StringUtils::Trim<char,unsigned_int>("   a   ",&offset,&length);
  local_3c = SVar3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x296);
  local_3c = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x297);
  length = SVar3;
  offset = SVar3;
  StringUtils::Trim<char,unsigned_int>("   abc   ",&offset,&length);
  local_3c = SVar3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&offset,&local_3c,0x29c);
  local_3c = SVar3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_3c,0x29d);
  return;
}

Assistant:

static void TestTrim(QTest &test) {
    SizeT offset = 0;
    SizeT length = 0;

    StringUtils::Trim("", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 0U, __LINE__);

    offset = 0;
    length = 1;
    StringUtils::Trim(" ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 0U, __LINE__);

    offset = 0;
    length = 1;
    StringUtils::Trim("  ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 0U, __LINE__);

    offset = 0;
    length = 2;
    StringUtils::Trim("  ", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 0U, __LINE__);

    offset = 0;
    length = 2;
    StringUtils::Trim(" a", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 4;
    StringUtils::Trim(" abc", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 1;
    length = 1;
    StringUtils::Trim(" a", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 1;
    length = 3;
    StringUtils::Trim(" abc", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 2;
    length = 1;
    StringUtils::Trim("  a", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 2;
    length = 3;
    StringUtils::Trim("  abc", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 3;
    StringUtils::Trim("  a", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 5;
    StringUtils::Trim("  abc", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 4;
    StringUtils::Trim("   a", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 6;
    StringUtils::Trim("   abc", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 2;
    StringUtils::Trim("a ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 4;
    StringUtils::Trim("abc ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 1;
    StringUtils::Trim("a ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 3;
    StringUtils::Trim("abc ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 1;
    StringUtils::Trim("a  ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 3;
    StringUtils::Trim("abc  ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 3;
    StringUtils::Trim("a  ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 5;
    StringUtils::Trim("abc  ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 4;
    StringUtils::Trim("a   ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 6;
    StringUtils::Trim("abc   ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 3;
    StringUtils::Trim(" a ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 5;
    StringUtils::Trim(" abc ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 5;
    StringUtils::Trim("  a  ", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 7;
    StringUtils::Trim("  abc  ", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 7;
    StringUtils::Trim("   a   ", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 9;
    StringUtils::Trim("   abc   ", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 1;
    length = 1;
    StringUtils::Trim(" a ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 1;
    length = 3;
    StringUtils::Trim(" abc ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 2;
    length = 1;
    StringUtils::Trim("  a  ", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 2;
    length = 3;
    StringUtils::Trim("  abc  ", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 3;
    length = 1;
    StringUtils::Trim("   a   ", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 3;
    length = 3;
    StringUtils::Trim("   abc   ", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);
}